

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsv.c
# Opt level: O3

uint custom(svdir *s,char c)

{
  int iVar1;
  __pid_t pid;
  int *piVar2;
  char *x4;
  int w;
  char a [10];
  char *prog [2];
  stat st;
  uint local_c8;
  char local_c2 [8];
  char local_ba;
  char *local_b8;
  undefined8 local_b0;
  stat local_a8;
  
  if (s->islog != 0) {
    return 0;
  }
  byte_copy(local_c2,10,"control/?");
  local_ba = c;
  iVar1 = stat(local_c2,&local_a8);
  if (iVar1 == 0) {
    if (((byte)local_a8.st_mode & 0x40) == 0) {
      return 0;
    }
    pid = fork();
    if (pid == 0) {
      if ((haslog != 0) && (iVar1 = fd_copy(1,logpipe[1]), iVar1 == -1)) {
        strerr_warn("runsv ",dir,": warning: ","unable to setup stdout for ",local_c2,": ",
                    &strerr_sys);
      }
      local_b0 = 0;
      local_b8 = local_c2;
      execve(local_c2,&local_b8,_environ);
      strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to run control/?",": ",(char *)0x0,
                 &strerr_sys);
    }
    else if (pid == -1) {
      x4 = "unable to fork for ";
      goto LAB_001029ca;
    }
    do {
      iVar1 = wait_pid((int *)&local_c8,pid);
      if (iVar1 != -1) {
        return (uint)(local_c8 < 0x100);
      }
      piVar2 = __errno_location();
    } while (*piVar2 == error_intr);
    strerr_warn("runsv ",dir,": warning: ","unable to wait for child ",local_c2,": ",&strerr_sys);
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == error_noent) {
      return 0;
    }
    x4 = "unable to stat ";
LAB_001029ca:
    strerr_warn("runsv ",dir,": warning: ",x4,local_c2,": ",&strerr_sys);
  }
  return 0;
}

Assistant:

unsigned int custom(struct svdir *s, char c) {
  int pid;
  int w;
  char a[10];
  struct stat st;
  char *prog[2];

  if (s->islog) return(0);
  byte_copy(a, 10, "control/?");
  a[8] =c;
  if (stat(a, &st) == 0) {
    if (st.st_mode & S_IXUSR) {
      if ((pid =fork()) == -1) {
        warn2("unable to fork for ", a);
        return(0);
      }
      if (! pid) {
        if (haslog && fd_copy(1, logpipe[1]) == -1)
          warn2("unable to setup stdout for ", a);
        prog[0] =a;
        prog[1] =0;
        execve(a, prog, environ);
        fatal("unable to run control/?");
      }
      while (wait_pid(&w, pid) == -1) {
        if (errno == error_intr) continue;
        warn2("unable to wait for child ", a);
        return(0);
      }
      return(! wait_exitcode(w));
    }
  }
  else {
    if (errno == error_noent) return(0);
    warn2("unable to stat ", a);
  }
  return(0);
}